

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::ConsumeBeginTo
          (CordRepBtree *tree,size_t end,size_t new_length)

{
  bool bVar1;
  size_t sVar2;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> SVar3;
  CordRepBtree *old;
  size_t new_length_local;
  size_t end_local;
  CordRepBtree *tree_local;
  
  sVar2 = CordRepBtree::end(tree);
  if (end <= sVar2) {
    bVar1 = RefcountAndFlags::IsOne(&(tree->super_CordRep).refcount);
    if (bVar1) {
      sVar2 = CordRepBtree::end(tree);
      SVar3 = Edges(tree,end,sVar2);
      old = (CordRepBtree *)SVar3.ptr_;
      SVar3.ptr_ = SVar3.len_;
      Unref(old,SVar3);
      set_end(tree,end);
      (tree->super_CordRep).length = new_length;
      end_local = (size_t)tree;
    }
    else {
      end_local = (size_t)CopyBeginTo(tree,end,new_length);
      CordRep::Unref(&tree->super_CordRep);
    }
    return (CordRepBtree *)end_local;
  }
  __assert_fail("end <= tree->end()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x33c,
                "static CordRepBtree *absl::cord_internal::CordRepBtree::ConsumeBeginTo(CordRepBtree *, size_t, size_t)"
               );
}

Assistant:

CordRepBtree* CordRepBtree::ConsumeBeginTo(CordRepBtree* tree, size_t end,
                                           size_t new_length) {
  assert(end <= tree->end());
  if (tree->refcount.IsOne()) {
    Unref(tree->Edges(end, tree->end()));
    tree->set_end(end);
    tree->length = new_length;
  } else {
    CordRepBtree* old = tree;
    tree = tree->CopyBeginTo(end, new_length);
    CordRep::Unref(old);
  }
  return tree;
}